

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

int ON_SubDFacePtr::Compare(ON_SubDFacePtr *lhs,ON_SubDFacePtr *rhs)

{
  uint uVar1;
  
  if (lhs != (ON_SubDFacePtr *)0x0) {
    uVar1 = 0xffffffff;
    if (rhs != (ON_SubDFacePtr *)0x0) {
      if (rhs->m_ptr <= lhs->m_ptr) {
        uVar1 = (uint)(rhs->m_ptr < lhs->m_ptr);
      }
    }
    return uVar1;
  }
  return 1;
}

Assistant:

int ON_SubDFacePtr::Compare(
  const ON_SubDFacePtr* lhs,
  const ON_SubDFacePtr* rhs
)
{
  if ( nullptr == lhs )
    return 1;
  if ( nullptr == rhs )
    return -1;

  if (lhs->m_ptr < rhs->m_ptr)
    return -1;
  if (lhs->m_ptr > rhs->m_ptr)
    return 1;

  return 0;
}